

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

ParseNodePtr __thiscall Parser::ParseImportCall<true>(Parser *this)

{
  ParseNodePtr pnode2;
  ParseNodeType *pnode1;
  ParseNodeCall *pPVar1;
  Parser *this_00;
  
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(&this->m_scan);
  this_00 = this;
  pnode2 = ParseExpr<true>(this,1,(BOOL *)0x0,0,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                           (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
  if ((this->m_token).tk == tkRParen) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(&this->m_scan);
    pnode1 = CreateNodeForOpT<(OpCode)4>(this);
    pPVar1 = CreateCallNode(this,knopCall,pnode1,pnode2);
    return &pPVar1->super_ParseNode;
  }
  Error(this_00,-0x7ff5fc12,L"",L"");
}

Assistant:

ParseNodePtr Parser::ParseImportCall()
{
    this->GetScanner()->Scan();
    ParseNodePtr specifier = ParseExpr<buildAST>(koplCma, nullptr, /* fAllowIn */FALSE, /* fAllowEllipsis */FALSE);
    if (m_token.tk != tkRParen)
    {
        Error(ERRnoRparen);
    }

    this->GetScanner()->Scan();
    return buildAST ? CreateCallNode(knopCall, CreateNodeForOpT<knopImport>(), specifier) : nullptr;
}